

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereSphereCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btSphereSphereCollisionAlgorithm::processCollision
          (btSphereSphereCollisionAlgorithm *this,btCollisionObjectWrapper *col0Wrap,
          btCollisionObjectWrapper *col1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  btPersistentManifold *pbVar4;
  btCollisionObject *pbVar5;
  btCollisionObject *pbVar6;
  btCollisionObject *pbVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  btVector3 pos1;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  pbVar4 = this->m_manifoldPtr;
  if (pbVar4 != (btPersistentManifold *)0x0) {
    resultOut->m_manifoldPtr = pbVar4;
    uVar2 = *(undefined8 *)(col0Wrap->m_worldTransform->m_origin).m_floats;
    uVar3 = *(undefined8 *)(col1Wrap->m_worldTransform->m_origin).m_floats;
    fVar8 = (float)uVar3;
    fVar10 = (float)uVar2 - fVar8;
    fVar9 = (float)((ulong)uVar3 >> 0x20);
    fVar11 = (float)((ulong)uVar2 >> 0x20) - fVar9;
    fVar1 = (col1Wrap->m_worldTransform->m_origin).m_floats[2];
    fVar12 = (col0Wrap->m_worldTransform->m_origin).m_floats[2] - fVar1;
    fVar13 = *(float *)&col1Wrap->m_shape[1].field_0xc * *(float *)&col1Wrap->m_shape->field_0x1c;
    fVar16 = SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11);
    fVar14 = *(float *)&col0Wrap->m_shape[1].field_0xc * *(float *)&col0Wrap->m_shape->field_0x1c +
             fVar13;
    if (fVar16 <= fVar14) {
      fVar17 = 1.0;
      fVar18 = 0.0;
      local_28 = ZEXT816(0x3f800000);
      fVar15 = 0.0;
      if (1.1920929e-07 < fVar16) {
        fVar18 = 1.0 / fVar16;
        fVar15 = fVar12 * fVar18;
        fVar17 = fVar10 * fVar18;
        fVar18 = fVar11 * fVar18;
        local_28._4_4_ = fVar18;
        local_28._0_4_ = fVar17;
        local_28._8_4_ = fVar15;
        local_28._12_4_ = 0;
      }
      local_18._4_4_ = fVar13 * fVar18 + fVar9;
      local_18._0_4_ = fVar13 * fVar17 + fVar8;
      local_18._8_4_ = fVar15 * fVar13 + fVar1;
      local_18._12_4_ = 0;
      (*(resultOut->super_Result)._vptr_Result[4])(fVar16 - fVar14,resultOut,local_28);
      pbVar4 = resultOut->m_manifoldPtr;
      if (pbVar4->m_cachedPoints != 0) {
        pbVar5 = resultOut->m_body0Wrap->m_collisionObject;
        pbVar6 = resultOut->m_body1Wrap->m_collisionObject;
        pbVar7 = pbVar6;
        if (pbVar4->m_body0 == pbVar5) {
          pbVar7 = pbVar5;
          pbVar5 = pbVar6;
        }
        btPersistentManifold::refreshContactPoints
                  (pbVar4,&pbVar7->m_worldTransform,&pbVar5->m_worldTransform);
      }
    }
    else if (pbVar4->m_cachedPoints != 0) {
      pbVar5 = resultOut->m_body0Wrap->m_collisionObject;
      pbVar6 = resultOut->m_body1Wrap->m_collisionObject;
      pbVar7 = pbVar6;
      if (pbVar4->m_body0 == pbVar5) {
        pbVar7 = pbVar5;
        pbVar5 = pbVar6;
      }
      btPersistentManifold::refreshContactPoints
                (pbVar4,&pbVar7->m_worldTransform,&pbVar5->m_worldTransform);
      return;
    }
  }
  return;
}

Assistant:

void btSphereSphereCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* col0Wrap,const btCollisionObjectWrapper* col1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)dispatchInfo;

	if (!m_manifoldPtr)
		return;

	resultOut->setPersistentManifold(m_manifoldPtr);

	btSphereShape* sphere0 = (btSphereShape*)col0Wrap->getCollisionShape();
	btSphereShape* sphere1 = (btSphereShape*)col1Wrap->getCollisionShape();

	btVector3 diff = col0Wrap->getWorldTransform().getOrigin()-  col1Wrap->getWorldTransform().getOrigin();
	btScalar len = diff.length();
	btScalar radius0 = sphere0->getRadius();
	btScalar radius1 = sphere1->getRadius();

#ifdef CLEAR_MANIFOLD
	m_manifoldPtr->clearManifold(); //don't do this, it disables warmstarting
#endif

	///iff distance positive, don't generate a new contact
	if ( len > (radius0+radius1))
	{
#ifndef CLEAR_MANIFOLD
		resultOut->refreshContactPoints();
#endif //CLEAR_MANIFOLD
		return;
	}
	///distance (negative means penetration)
	btScalar dist = len - (radius0+radius1);

	btVector3 normalOnSurfaceB(1,0,0);
	if (len > SIMD_EPSILON)
	{
		normalOnSurfaceB = diff / len;
	}

	///point on A (worldspace)
	///btVector3 pos0 = col0->getWorldTransform().getOrigin() - radius0 * normalOnSurfaceB;
	///point on B (worldspace)
	btVector3 pos1 = col1Wrap->getWorldTransform().getOrigin() + radius1* normalOnSurfaceB;

	/// report a contact. internally this will be kept persistent, and contact reduction is done
	
	
	resultOut->addContactPoint(normalOnSurfaceB,pos1,dist);

#ifndef CLEAR_MANIFOLD
	resultOut->refreshContactPoints();
#endif //CLEAR_MANIFOLD

}